

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall
QPicturePaintEngine::writeCmdLength(QPicturePaintEngine *this,int pos,QRectF *r,bool corr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPicturePaintEnginePrivate *pQVar5;
  char *pcVar6;
  int *piVar7;
  byte in_CL;
  qreal *in_RDX;
  int in_ESI;
  qreal in_RDI;
  long in_FS_OFFSET;
  qreal qVar8;
  int w2;
  char *p;
  int length;
  int newpos;
  QPicturePaintEnginePrivate *d;
  int maxy;
  int maxx;
  int miny;
  int minx;
  anon_class_1_0_00000001 clampToIntRange;
  QRectF cr;
  QRectF br;
  undefined4 in_stack_ffffffffffffff08;
  quint32 in_stack_ffffffffffffff0c;
  QPaintEngine *in_stack_ffffffffffffff10;
  QRectF *in_stack_ffffffffffffff18;
  QRect *in_stack_ffffffffffffff20;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  undefined1 local_69;
  undefined8 local_68;
  QRectF *in_stack_ffffffffffffffa0;
  QTransform *in_stack_ffffffffffffffa8;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QPicturePaintEngine *)0x30f7b1);
  iVar2 = QBuffer::pos();
  iVar3 = iVar2 - in_ESI;
  local_28.xp = *in_RDX;
  local_28.yp = in_RDX[1];
  local_28.w = in_RDX[2];
  local_28.h = in_RDX[3];
  if (iVar3 < 0xff) {
    QBuffer::seek((longlong)&pQVar5->pic_d->pictb);
    QDataStream::operator<<
              ((QDataStream *)in_stack_ffffffffffffff10,(quint8)(in_stack_ffffffffffffff0c >> 0x18))
    ;
  }
  else {
    QDataStream::operator<<((QDataStream *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    QBuffer::seek((longlong)&pQVar5->pic_d->pictb);
    QDataStream::operator<<
              ((QDataStream *)in_stack_ffffffffffffff10,(quint8)(in_stack_ffffffffffffff0c >> 0x18))
    ;
    QBuffer::buffer();
    pcVar6 = QByteArray::data((QByteArray *)in_stack_ffffffffffffff10);
    memmove(pcVar6 + (long)in_ESI + 4,pcVar6 + in_ESI,(long)iVar3);
    QDataStream::operator<<((QDataStream *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    iVar2 = iVar2 + 4;
  }
  QBuffer::seek((longlong)&pQVar5->pic_d->pictb);
  qVar8 = QRectF::width(&local_28);
  if ((0.0 < qVar8) || (qVar8 = QRectF::height(&local_28), 0.0 < qVar8)) {
    if ((in_CL & 1) != 0) {
      QPaintEngine::painter(in_stack_ffffffffffffff10);
      QPainter::pen((QPainter *)in_stack_ffffffffffffff10);
      iVar4 = QPen::width((QPen *)0x30f9b2);
      iVar4 = iVar4 / 2;
      qVar8 = QRectF::left(&local_28);
      in_stack_ffffffffffffff20 = (QRect *)(qVar8 - (double)iVar4);
      qVar8 = QRectF::top(&local_28);
      in_stack_ffffffffffffff10 = (QPaintEngine *)(qVar8 - (double)iVar4);
      qVar8 = QRectF::right(&local_28);
      in_stack_ffffffffffffff18 = (QRectF *)(qVar8 + (double)iVar4);
      qVar8 = QRectF::bottom(&local_28);
      QRectF::setCoords(&local_28,(qreal)in_stack_ffffffffffffff20,(qreal)in_stack_ffffffffffffff10,
                        (qreal)in_stack_ffffffffffffff18,qVar8 + (double)iVar4);
    }
    QPaintEngine::painter(in_stack_ffffffffffffff10);
    QPainter::transform((QPainter *)0x30fa60);
    QTransform::mapRect(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_28.xp = local_48;
    local_28.yp = local_40;
    local_28.w = local_38;
    local_28.h = local_30;
    QPaintEngine::painter(in_stack_ffffffffffffff10);
    bVar1 = QPainter::hasClipping((QPainter *)in_stack_ffffffffffffff10);
    if (bVar1) {
      local_68 = 0xffffffffffffffff;
      QPaintEngine::painter(in_stack_ffffffffffffff10);
      QPainter::clipBoundingRect((QPainter *)CONCAT44(iVar2,iVar3));
      QRectF::operator&=(in_stack_ffffffffffffff18,(QRectF *)in_stack_ffffffffffffff10);
    }
    qVar8 = QRectF::width(&local_28);
    if ((0.0 < qVar8) || (qVar8 = QRectF::height(&local_28), 0.0 < qVar8)) {
      local_69 = 0xaa;
      QRectF::left(&local_28);
      writeCmdLength::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff10,in_RDI);
      local_70 = qFloor<double>(1.58601742201259e-317);
      QRectF::top(&local_28);
      writeCmdLength::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff10,in_RDI);
      local_74 = qFloor<double>(1.58603619650713e-317);
      QRectF::right(&local_28);
      writeCmdLength::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff10,in_RDI);
      local_78 = qCeil<double>(1.58605497100167e-317);
      QRectF::bottom(&local_28);
      writeCmdLength::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff10,in_RDI);
      local_7c = qCeil<double>(1.58607374549622e-317);
      iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if ((iVar2 < 1) &&
         (iVar2 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff0c,
                                                  in_stack_ffffffffffffff08)), iVar2 < 1)) {
        QRect::setCoords(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                         (int)in_stack_ffffffffffffff18,
                         (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (int)in_stack_ffffffffffffff10);
      }
      else {
        local_80 = QRect::left((QRect *)0x30fc5a);
        piVar7 = qMin<int>(&local_70,&local_80);
        local_70 = *piVar7;
        local_84 = QRect::top((QRect *)0x30fc8e);
        piVar7 = qMin<int>(&local_74,&local_84);
        local_74 = *piVar7;
        iVar2 = QRect::x((QRect *)0x30fcc2);
        local_88 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff0c,iVar2));
        local_88 = iVar2 + local_88;
        piVar7 = qMax<int>(&local_78,&local_88);
        local_78 = *piVar7;
        iVar3 = QRect::y((QRect *)0x30fd15);
        local_8c = QRect::height((QRect *)CONCAT44(iVar3,iVar2));
        local_8c = iVar3 + local_8c;
        piVar7 = qMax<int>(&local_7c,&local_8c);
        local_7c = *piVar7;
        QRect::setCoords(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                         (int)in_stack_ffffffffffffff18,
                         (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (int)in_stack_ffffffffffffff10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPicturePaintEngine::writeCmdLength(int pos, const QRectF &r, bool corr)
{
    Q_D(QPicturePaintEngine);
    int newpos = d->pic_d->pictb.pos();            // new position
    int length = newpos - pos;
    QRectF br(r);

    if (length < 255) {                         // write 8-bit length
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)length;
    } else {                                    // write 32-bit length
        d->s << (quint32)0;                    // extend the buffer
        d->pic_d->pictb.seek(pos - 1);             // position to right index
        d->s << (quint8)255;                   // indicate 32-bit length
        char *p = d->pic_d->pictb.buffer().data();
        memmove(p+pos+4, p+pos, length);        // make room for 4 byte
        d->s << (quint32)length;
        newpos += 4;
    }
    d->pic_d->pictb.seek(newpos);                  // set to new position

    if (br.width() > 0.0 || br.height() > 0.0) {
        if (corr) {                             // widen bounding rect
            int w2 = painter()->pen().width() / 2;
            br.setCoords(br.left() - w2, br.top() - w2,
                         br.right() + w2, br.bottom() + w2);
        }
        br = painter()->transform().mapRect(br);
        if (painter()->hasClipping()) {
            QRectF cr = painter()->clipBoundingRect();
            br &= cr;
        }

        if (br.width() > 0.0 || br.height() > 0.0) {
            const auto clampToIntRange = [](qreal v)
            {
                return qBound(qreal((std::numeric_limits<int>::min)()),
                              v,
                              qreal((std::numeric_limits<int>::max)()));
            };
            int minx = qFloor(clampToIntRange(br.left()));
            int miny = qFloor(clampToIntRange(br.top()));
            int maxx = qCeil(clampToIntRange(br.right()));
            int maxy = qCeil(clampToIntRange(br.bottom()));

            if (d->pic_d->brect.width() > 0 || d->pic_d->brect.height() > 0) {
                minx = qMin(minx, d->pic_d->brect.left());
                miny = qMin(miny, d->pic_d->brect.top());
                maxx = qMax(maxx, d->pic_d->brect.x() + d->pic_d->brect.width());
                maxy = qMax(maxy, d->pic_d->brect.y() + d->pic_d->brect.height());
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            } else {
                d->pic_d->brect.setCoords(minx, miny, maxx - 1, maxy - 1);
            }
        }
    }
}